

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AlterFinishAddColumn(Parse *pParse,Token *pColDef)

{
  uint uVar1;
  sqlite3 *db;
  Table *pTVar2;
  char *pcVar3;
  Column *pCVar4;
  Expr *pEVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  Table *pTab;
  byte *__dest;
  byte *pbVar9;
  uint uVar10;
  char *pcVar11;
  Schema **ppSVar12;
  Expr *pExpr;
  char *pcVar13;
  int iDb;
  ulong uVar14;
  sqlite3_value *pVal;
  
  if ((pParse->nErr == 0) && (db = pParse->db, db->mallocFailed == '\0')) {
    pTVar2 = pParse->pNewTable;
    if (pTVar2->pSchema == (Schema *)0x0) {
      uVar14 = 0xfff0bdc0;
    }
    else {
      uVar1 = db->nDb;
      if ((int)uVar1 < 1) {
        uVar14 = 0;
      }
      else {
        ppSVar12 = &db->aDb->pSchema;
        uVar14 = 0;
        do {
          if (*ppSVar12 == pTVar2->pSchema) goto LAB_0015756c;
          uVar14 = uVar14 + 1;
          ppSVar12 = ppSVar12 + 4;
        } while (uVar1 != uVar14);
        uVar14 = (ulong)uVar1;
      }
    }
LAB_0015756c:
    iDb = (int)uVar14;
    pcVar13 = db->aDb[iDb].zName;
    pcVar3 = pTVar2->zName;
    pCVar4 = pTVar2->aCol;
    lVar8 = (long)pTVar2->nCol;
    pEVar5 = pCVar4[lVar8 + -1].pDflt;
    pTab = sqlite3FindTable(db,pcVar3 + 0x10,pcVar13);
    iVar6 = sqlite3AuthCheck(pParse,0x1a,pcVar13,pTab->zName,(char *)0x0);
    if (iVar6 == 0) {
      pExpr = (Expr *)0x0;
      if ((pEVar5 != (Expr *)0x0) && (pEVar5->op != 'b')) {
        pExpr = pEVar5;
      }
      if ((pCVar4[lVar8 + -1].colFlags & 1) == 0) {
        if (pTVar2->pIndex == (Index *)0x0) {
          if ((((db->flags & 0x40000) == 0) || (pTVar2->pFKey == (FKey *)0x0)) ||
             (pExpr == (Expr *)0x0)) {
            if ((pCVar4[lVar8 + -1].notNull == '\0') || (pExpr != (Expr *)0x0)) {
              if (pExpr != (Expr *)0x0) {
                iVar6 = sqlite3ValueFromExpr(db,pExpr,'\x01','b',&pVal);
                if (iVar6 != 0) {
                  db->mallocFailed = '\x01';
                  return;
                }
                if (pVal == (sqlite3_value *)0x0) {
                  sqlite3ErrorMsg(pParse,"Cannot add a column with non-constant default");
                  return;
                }
                sqlite3ValueFree(pVal);
              }
              pcVar11 = pColDef->z;
              if (pcVar11 != (char *)0x0) {
                uVar1 = pColDef->n;
                __dest = (byte *)sqlite3DbMallocRaw(db,uVar1 + 1);
                if (__dest != (byte *)0x0) {
                  memcpy(__dest,pcVar11,(long)(int)uVar1);
                  __dest[(int)uVar1] = 0;
                  uVar1 = db->flags;
                  uVar10 = pColDef->n - 1;
                  uVar7 = uVar1;
                  if (uVar10 != 0) {
                    pbVar9 = __dest + uVar10;
                    do {
                      if (((ulong)*pbVar9 != 0x3b) && ((""[*pbVar9] & 1) == 0)) break;
                      *pbVar9 = 0;
                      pbVar9 = pbVar9 + -1;
                    } while (__dest < pbVar9);
                    uVar7 = db->flags;
                  }
                  db->flags = uVar7 | 0x100000;
                  pcVar11 = "sqlite_master";
                  if (iDb == 1) {
                    pcVar11 = "sqlite_temp_master";
                  }
                  sqlite3NestedParse(pParse,
                                     "UPDATE \"%w\".%s SET sql = substr(sql,1,%d) || \', \' || %Q || substr(sql,%d) WHERE type = \'table\' AND name = %Q"
                                     ,pcVar13,pcVar11,(ulong)(uint)pTVar2->addColOffset,__dest,
                                     (ulong)(pTVar2->addColOffset + 1),pcVar3 + 0x10);
                  sqlite3DbFree(db,__dest);
                  db->flags = uVar1;
                }
              }
              sqlite3MinimumFileFormat(pParse,iDb,3 - (uint)(pExpr == (Expr *)0x0));
              reloadTableSchema(pParse,pTab,pTab->zName);
              return;
            }
            pcVar13 = "Cannot add a NOT NULL column with default value NULL";
          }
          else {
            pcVar13 = "Cannot add a REFERENCES column with non-NULL default value";
          }
        }
        else {
          pcVar13 = "Cannot add a UNIQUE column";
        }
      }
      else {
        pcVar13 = "Cannot add a PRIMARY KEY column";
      }
      sqlite3ErrorMsg(pParse,pcVar13);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AlterFinishAddColumn(Parse *pParse, Token *pColDef){
  Table *pNew;              /* Copy of pParse->pNewTable */
  Table *pTab;              /* Table being altered */
  int iDb;                  /* Database number */
  const char *zDb;          /* Database name */
  const char *zTab;         /* Table name */
  char *zCol;               /* Null-terminated column definition */
  Column *pCol;             /* The new column */
  Expr *pDflt;              /* Default value for the new column */
  sqlite3 *db;              /* The database connection; */

  db = pParse->db;
  if( pParse->nErr || db->mallocFailed ) return;
  pNew = pParse->pNewTable;
  assert( pNew );

  assert( sqlite3BtreeHoldsAllMutexes(db) );
  iDb = sqlite3SchemaToIndex(db, pNew->pSchema);
  zDb = db->aDb[iDb].zName;
  zTab = &pNew->zName[16];  /* Skip the "sqlite_altertab_" prefix on the name */
  pCol = &pNew->aCol[pNew->nCol-1];
  pDflt = pCol->pDflt;
  pTab = sqlite3FindTable(db, zTab, zDb);
  assert( pTab );

#ifndef SQLITE_OMIT_AUTHORIZATION
  /* Invoke the authorization callback. */
  if( sqlite3AuthCheck(pParse, SQLITE_ALTER_TABLE, zDb, pTab->zName, 0) ){
    return;
  }
#endif

  /* If the default value for the new column was specified with a 
  ** literal NULL, then set pDflt to 0. This simplifies checking
  ** for an SQL NULL default below.
  */
  if( pDflt && pDflt->op==TK_NULL ){
    pDflt = 0;
  }

  /* Check that the new column is not specified as PRIMARY KEY or UNIQUE.
  ** If there is a NOT NULL constraint, then the default value for the
  ** column must not be NULL.
  */
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    sqlite3ErrorMsg(pParse, "Cannot add a PRIMARY KEY column");
    return;
  }
  if( pNew->pIndex ){
    sqlite3ErrorMsg(pParse, "Cannot add a UNIQUE column");
    return;
  }
  if( (db->flags&SQLITE_ForeignKeys) && pNew->pFKey && pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a REFERENCES column with non-NULL default value");
    return;
  }
  if( pCol->notNull && !pDflt ){
    sqlite3ErrorMsg(pParse, 
        "Cannot add a NOT NULL column with default value NULL");
    return;
  }

  /* Ensure the default expression is something that sqlite3ValueFromExpr()
  ** can handle (i.e. not CURRENT_TIME etc.)
  */
  if( pDflt ){
    sqlite3_value *pVal;
    if( sqlite3ValueFromExpr(db, pDflt, SQLITE_UTF8, SQLITE_AFF_NONE, &pVal) ){
      db->mallocFailed = 1;
      return;
    }
    if( !pVal ){
      sqlite3ErrorMsg(pParse, "Cannot add a column with non-constant default");
      return;
    }
    sqlite3ValueFree(pVal);
  }

  /* Modify the CREATE TABLE statement. */
  zCol = sqlite3DbStrNDup(db, (char*)pColDef->z, pColDef->n);
  if( zCol ){
    char *zEnd = &zCol[pColDef->n-1];
    int savedDbFlags = db->flags;
    while( zEnd>zCol && (*zEnd==';' || sqlite3Isspace(*zEnd)) ){
      *zEnd-- = '\0';
    }
    db->flags |= SQLITE_PreferBuiltin;
    sqlite3NestedParse(pParse, 
        "UPDATE \"%w\".%s SET "
          "sql = substr(sql,1,%d) || ', ' || %Q || substr(sql,%d) "
        "WHERE type = 'table' AND name = %Q", 
      zDb, SCHEMA_TABLE(iDb), pNew->addColOffset, zCol, pNew->addColOffset+1,
      zTab
    );
    sqlite3DbFree(db, zCol);
    db->flags = savedDbFlags;
  }

  /* If the default value of the new column is NULL, then set the file
  ** format to 2. If the default value of the new column is not NULL,
  ** the file format becomes 3.
  */
  sqlite3MinimumFileFormat(pParse, iDb, pDflt ? 3 : 2);

  /* Reload the schema of the modified table. */
  reloadTableSchema(pParse, pTab, pTab->zName);
}